

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  int i;
  long lVar1;
  
  memset(this,0,0x3808);
  (this->DisplaySize).x = -1.0;
  (this->DisplaySize).y = -1.0;
  this->DeltaTime = 0.016666668;
  this->IniSavingRate = 5.0;
  this->IniFilename = "imgui.ini";
  this->LogFilename = "imgui_log.txt";
  this->MouseDoubleClickTime = 0.3;
  this->MouseDoubleClickMaxDist = 6.0;
  for (lVar1 = 0x3e; lVar1 != 0x2c3; lVar1 = lVar1 + 1) {
    (&this->ConfigFlags)[lVar1] = -1;
  }
  this->KeyRepeatRate = 0.05;
  this->UserData = (void *)0x0;
  this->Fonts = (ImFontAtlas *)0x0;
  this->FontGlobalScale = 1.0;
  this->FontDefault = (ImFont *)0x0;
  this->FontAllowUserScaling = false;
  (this->DisplayFramebufferScale).x = 1.0;
  (this->DisplayFramebufferScale).y = 1.0;
  this->ConfigDockingNoSplit = false;
  this->ConfigDockingWithShift = false;
  this->ConfigDockingAlwaysTabBar = false;
  this->ConfigDockingTransparentPayload = false;
  this->ConfigViewportsNoAutoMerge = false;
  this->ConfigViewportsNoTaskBarIcon = false;
  this->ConfigViewportsNoDecoration = true;
  this->ConfigViewportsNoDefaultParent = false;
  this->MouseDrawCursor = false;
  this->ConfigMacOSXBehaviors = false;
  this->ConfigInputTrickleEventQueue = true;
  this->ConfigInputTextCursorBlink = true;
  this->ConfigWindowsResizeFromEdges = true;
  this->ConfigWindowsMoveFromTitleBarOnly = false;
  this->ConfigMemoryCompactTimer = 60.0;
  this->BackendPlatformName = (char *)0x0;
  this->BackendRendererName = (char *)0x0;
  this->BackendPlatformUserData = (void *)0x0;
  this->BackendRendererUserData = (void *)0x0;
  this->BackendLanguageUserData = (void *)0x0;
  this->GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;
  this->SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
  this->ClipboardUserData = (void *)0x0;
  this->SetPlatformImeDataFn = SetPlatformImeDataFn_DefaultImpl;
  (this->MousePos).x = -3.4028235e+38;
  (this->MousePos).y = -3.4028235e+38;
  (this->MousePosPrev).x = -3.4028235e+38;
  (this->MousePosPrev).y = -3.4028235e+38;
  this->MouseDragThreshold = 6.0;
  this->KeyRepeatDelay = 0.275;
  for (lVar1 = -0x14; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)&this->MouseDragMaxDistanceAbs[0].x + lVar1) = 0xbf800000;
    *(undefined4 *)((long)this->MouseDownDurationPrev + lVar1) = 0xbf800000;
  }
  for (lVar1 = 0xe0c; lVar1 != 0x365c; lVar1 = lVar1 + 0x10) {
    *(undefined8 *)((long)&this->ConfigFlags + lVar1) = 0xbf800000bf800000;
  }
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    this->NavInputsDownDuration[lVar1] = -1.0;
  }
  this->BackendUsingLegacyKeyArrays = -1;
  this->BackendUsingLegacyNavInputArray = true;
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));
    IM_STATIC_ASSERT(IM_ARRAYSIZE(ImGuiIO::MouseDown) == ImGuiMouseButton_COUNT && IM_ARRAYSIZE(ImGuiIO::MouseClicked) == ImGuiMouseButton_COUNT);

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f / 60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini"; // Important: "imgui.ini" is relative to current working dir, most apps will want to lock this to an absolute path (e.g. same path as executables).
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
#endif
    KeyRepeatDelay = 0.275f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);

    // Docking options (when ImGuiConfigFlags_DockingEnable is set)
    ConfigDockingNoSplit = false;
    ConfigDockingWithShift = false;
    ConfigDockingAlwaysTabBar = false;
    ConfigDockingTransparentPayload = false;

    // Viewport options (when ImGuiConfigFlags_ViewportsEnable is set)
    ConfigViewportsNoAutoMerge = false;
    ConfigViewportsNoTaskBarIcon = false;
    ConfigViewportsNoDecoration = true;
    ConfigViewportsNoDefaultParent = false;

    // Miscellaneous options
    MouseDrawCursor = false;
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTrickleEventQueue = true;
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;
    ConfigMemoryCompactTimer = 60.0f;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    SetPlatformImeDataFn = SetPlatformImeDataFn_DefaultImpl;

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysData); i++) { KeysData[i].DownDuration = KeysData[i].DownDurationPrev = -1.0f; }
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
    BackendUsingLegacyKeyArrays = (ImS8)-1;
    BackendUsingLegacyNavInputArray = true; // assume using legacy array until proven wrong
}